

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O3

void diy::Serialization<std::vector<diy::Bounds<double>,_std::allocator<diy::Bounds<double>_>_>_>::
     save(BinaryBuffer *bb,Vector *v)

{
  Bounds<double> *x;
  size_t s;
  long local_28;
  
  local_28 = ((long)(v->
                    super__Vector_base<diy::Bounds<double>,_std::allocator<diy::Bounds<double>_>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(v->
                    super__Vector_base<diy::Bounds<double>,_std::allocator<diy::Bounds<double>_>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 5) * -0x3333333333333333;
  (*bb->_vptr_BinaryBuffer[2])(bb,&local_28,8);
  if (local_28 != 0) {
    x = (v->super__Vector_base<diy::Bounds<double>,_std::allocator<diy::Bounds<double>_>_>)._M_impl.
        super__Vector_impl_data._M_start;
    save<diy::Bounds<double>>
              (bb,x,((long)(v->
                           super__Vector_base<diy::Bounds<double>,_std::allocator<diy::Bounds<double>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)x >> 5) *
                    -0x3333333333333333);
  }
  return;
}

Assistant:

static void         save(BinaryBuffer& bb, const Vector& v)
    {
      size_t s = v.size();
      diy::save(bb, s);
      if (s > 0)
        diy::save(bb, &v[0], v.size());
    }